

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

double __thiscall
RandomForest::Node<float>::PredictOneSample
          (Node<float> *this,shared_ptr<std::vector<float,_std::allocator<float>_>_> *i_inData)

{
  element_type *peVar1;
  pointer pfVar2;
  Node<float> *pNVar3;
  ulong uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  double dVar5;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> local_28;
  shared_ptr<std::vector<float,_std::allocator<float>_>_> local_18;
  
  uVar4 = (ulong)this->featureIndex;
  if (uVar4 == 0xffffffffffffffff) {
    dVar5 = this->splitValue;
  }
  else {
    peVar1 = (i_inData->
             super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    pfVar2 = (peVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pfVar2 >> 2) <= uVar4) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
    }
    dVar5 = (double)pfVar2[uVar4];
    if (dVar5 < this->splitValue || dVar5 == this->splitValue) {
      pNVar3 = (this->right).
               super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28.
      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (i_inData->
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_28.
          super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_28.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_28.
                super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_28.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_28.
                super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_28.
      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      dVar5 = PredictOneSample(pNVar3,&local_28);
      this_00._M_pi =
           local_28.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      pNVar3 = (this->left).
               super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_18.
      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (i_inData->
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_18.
          super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_18.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_18.
                super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_18.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_18.
                super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_18.
      super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      dVar5 = PredictOneSample(pNVar3,&local_18);
      this_00._M_pi =
           local_18.
           super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  return dVar5;
}

Assistant:

double RandomForest::Node<T>::PredictOneSample(const std::shared_ptr<std::vector<T> > i_inData)
{
    if (featureIndex == -1)
    {
        return splitValue;
    }
    if (i_inData->at(featureIndex)>splitValue)
    {
        return left->PredictOneSample(i_inData);
    }
    else
    {
        return right->PredictOneSample(i_inData);
    }
}